

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraph.cxx
# Opt level: O3

bool __thiscall
cmCMakePresetsGraphInternal::InListCondition::Evaluate
          (InListCondition *this,
          vector<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>,_std::allocator<std::function<cmCMakePresetsGraphInternal::ExpandMacroResult_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int)>_>_>
          *expanders,int version,optional<bool> *out)

{
  pointer pcVar1;
  pointer pbVar2;
  bool bVar3;
  ExpandMacroResult EVar4;
  int iVar5;
  pointer pbVar6;
  byte bVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> item;
  string str;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (this->String)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->String)._M_string_length);
  EVar4 = anon_unknown.dwarf_ce93d7::ExpandMacros(&local_50,expanders,version);
  if (EVar4 == Ignore) {
    bVar7 = 1;
    if ((out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
        _M_engaged == true) {
      (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool>.
      _M_engaged = false;
    }
  }
  else if (EVar4 == Error) {
    bVar7 = 0;
  }
  else {
    pbVar2 = (this->List).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar6 = (this->List).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pbVar6 != pbVar2; pbVar6 = pbVar6 + 1)
    {
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (pbVar6->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + pbVar6->_M_string_length);
      EVar4 = anon_unknown.dwarf_ce93d7::ExpandMacros(&local_70,expanders,version);
      if (EVar4 == Ignore) {
        if ((out->super__Optional_base<bool,_true,_true>)._M_payload.
            super__Optional_payload_base<bool>._M_engaged == true) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool>._M_engaged = false;
        }
LAB_002aec33:
        this = (InListCondition *)0x1;
        bVar3 = false;
      }
      else if (EVar4 == Error) {
        bVar3 = false;
        this = (InListCondition *)0x0;
      }
      else {
        bVar3 = true;
        if ((local_50._M_string_length == local_70._M_string_length) &&
           ((local_50._M_string_length == 0 ||
            (iVar5 = bcmp(local_50._M_dataplus._M_p,local_70._M_dataplus._M_p,
                          local_50._M_string_length), iVar5 == 0)))) {
          (out->super__Optional_base<bool,_true,_true>)._M_payload.
          super__Optional_payload_base<bool> = (_Optional_payload_base<bool>)0x101;
          goto LAB_002aec33;
        }
      }
      bVar7 = (byte)this;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (!bVar3) goto LAB_002aec7a;
    }
    (out->super__Optional_base<bool,_true,_true>)._M_payload.super__Optional_payload_base<bool> =
         (_Optional_payload_base<bool>)0x100;
    bVar7 = 1;
  }
LAB_002aec7a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return (bool)(bVar7 & 1);
}

Assistant:

bool cmCMakePresetsGraphInternal::InListCondition::Evaluate(
  const std::vector<MacroExpander>& expanders, int version,
  cm::optional<bool>& out) const
{
  std::string str = this->String;
  CHECK_EXPAND(out, str, expanders, version);

  for (auto item : this->List) {
    CHECK_EXPAND(out, item, expanders, version);
    if (str == item) {
      out = true;
      return true;
    }
  }

  out = false;
  return true;
}